

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O0

void skiwi::inline_fixnum_to_flonum(asmcode *code,compiler_options *param_2)

{
  operand local_a0 [2];
  operation local_98 [2];
  operand local_90 [2];
  operation local_88;
  operand local_84 [3];
  operation local_78;
  operand local_74 [2];
  operation local_6c;
  operand local_68 [2];
  operation local_60 [2];
  operand local_58 [2];
  operation local_50;
  operand local_4c [2];
  operation local_44;
  uint64_t local_40;
  uint64_t header;
  operand local_30;
  operation local_2c [2];
  operand local_24 [2];
  operation local_1c;
  compiler_options *local_18;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  local_1c = SAR;
  local_24[1] = 9;
  local_24[0] = NUMBER;
  local_2c[1] = 1;
  local_18 = param_2;
  param_1_local = (compiler_options *)code;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1c,local_24 + 1,local_24,(int *)(local_2c + 1));
  local_2c[0] = CVTSI2SD;
  local_30 = XMM0;
  header._4_4_ = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,local_2c,&local_30,(operand *)((long)&header + 4));
  local_40 = make_block_header(1,T_FLONUM);
  local_44 = MOV;
  local_4c[1] = 10;
  local_4c[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_44,local_4c + 1,local_4c);
  local_50 = OR;
  local_58[1] = 10;
  local_58[0] = NUMBER;
  local_60[1] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,&local_50,local_58 + 1,local_58,(int *)(local_60 + 1));
  local_60[0] = MOV;
  local_68[1] = 9;
  local_68[0] = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            ((asmcode *)param_1_local,local_60,local_68 + 1,local_68,&local_40);
  local_6c = MOV;
  local_74[1] = 0x20;
  local_74[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_6c,local_74 + 1,local_74);
  local_78 = MOVQ;
  local_84[2] = 0x20;
  local_84[1] = 8;
  local_84[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_78,local_84 + 2,(int *)(local_84 + 1),local_84);
  local_88 = ADD;
  local_90[1] = 0x10;
  local_90[0] = NUMBER;
  local_98[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,&local_88,local_90 + 1,local_90,(int *)(local_98 + 1));
  local_98[0] = MOV;
  local_a0[1] = 9;
  local_a0[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,local_98,local_a0 + 1,local_a0);
  return;
}

Assistant:

void inline_fixnum_to_flonum(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::SAR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 1);
  code.add(ASM::asmcode::CVTSI2SD, ASM::asmcode::XMM0, ASM::asmcode::RAX);
  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RBX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, header);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::MOVQ, MEM_ALLOC, CELLS(1), ASM::asmcode::XMM0);
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::RBX);
  }